

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_failurecount_assertion.hpp
# Opt level: O1

AssertionResult * __thiscall
iutest::detail::StatementsFailureCount::GetResult
          (AssertionResult *__return_storage_ptr__,StatementsFailureCount *this,size_t cnt,
          char *stetements_str)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  pointer pcVar3;
  TestFlag *pTVar4;
  AssertionResult *pAVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  size_t n;
  unsigned_long local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  size_t local_78;
  pointer local_70;
  pointer local_68;
  char *local_60;
  AssertionResult local_58;
  
  local_68 = (this->super_Collector<iutest::detail::NoTestPartResultReporter>).m_results.
             super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_70 = (this->super_Collector<iutest::detail::NoTestPartResultReporter>).m_results.
             super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  lVar7 = ((long)local_70 - (long)local_68 >> 4) * -0x5555555555555555;
  local_88 = 0;
  local_78 = cnt;
  local_60 = stetements_str;
  if (local_70 != local_68) {
    lVar8 = lVar7 + (ulong)(lVar7 == 0);
    lVar6 = 0x2c;
    do {
      iVar2 = *(int *)((long)&(((this->super_Collector<iutest::detail::NoTestPartResultReporter>).
                                m_results.
                                super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                ._M_impl.super__Vector_impl_data._M_start)->super_iuCodeMessage).
                              m_message._M_dataplus + lVar6);
      pTVar4 = TestFlag::GetInstance();
      if ((0 < iVar2) || ((iVar2 == -1 & (byte)pTVar4->m_test_flags >> 7) != 0)) {
        local_88 = local_88 + 1;
      }
      lVar6 = lVar6 + 0x30;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  if (local_88 < local_78) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    paVar1 = &local_58.m_message.field_2;
    local_58.m_message._M_string_length = 0;
    local_58.m_message.field_2._M_local_buf[0] = '\0';
    local_58.m_result = false;
    local_58.m_message._M_dataplus._M_p = (pointer)paVar1;
    pAVar5 = AssertionResult::operator<<(&local_58,&local_60);
    pAVar5 = AssertionResult::operator<<
                       (pAVar5,(char (*) [36])"\nExpected: failure count less than ");
    pAVar5 = AssertionResult::operator<<(pAVar5,&local_78);
    pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [12])"\n  Actual: ");
    pAVar5 = AssertionResult::operator<<(pAVar5,&local_88);
    local_80 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)local_80;
    pcVar3 = (pAVar5->m_message)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + (pAVar5->m_message)._M_string_length
              );
    __return_storage_ptr__->m_result = pAVar5->m_result;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_58.m_message._M_dataplus._M_p,
                      CONCAT71(local_58.m_message.field_2._M_allocated_capacity._1_7_,
                               local_58.m_message.field_2._M_local_buf[0]) + 1);
    }
    AssertionResult::operator<<(__return_storage_ptr__,(char (*) [19])"\nReported results:");
    if (local_70 != local_68) {
      lVar7 = lVar7 + (ulong)(lVar7 == 0);
      lVar6 = 0;
      do {
        pAVar5 = AssertionResult::operator<<(__return_storage_ptr__,(char (*) [2])0x133249);
        local_58.m_message._M_dataplus._M_p =
             *(pointer *)
              ((long)&(((this->super_Collector<iutest::detail::NoTestPartResultReporter>).m_results.
                        super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                        ._M_impl.super__Vector_impl_data._M_start)->super_iuCodeMessage).m_message.
                      _M_dataplus + lVar6);
        AssertionResult::operator<<(pAVar5,(char **)&local_58);
        lVar6 = lVar6 + 0x30;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

AssertionResult GetResult(size_t cnt, const char* stetements_str)
    {
        const size_t num = count();
        size_t n=0;
        for( size_t i=0; i < num; ++i )
        {
            if( GetTestPartResult(i).failed() )
            {
                ++n;
            }
        }
        if( n < cnt )
        {
            return AssertionSuccess();
        }
        AssertionResult ar = AssertionFailure() << stetements_str << "\nExpected: failure count less than " << cnt << "\n  Actual: " << n;
        ar << "\nReported results:";
        for( size_t i=0; i < num; ++i )
        {
            ar << "\n" << GetTestPartResult(i).message();
        }
        return ar;
    }